

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

void __thiscall llvm::yaml::Output::scalarString(Output *this,StringRef *S,QuotingType MustQuote)

{
  char *pcVar1;
  StringRef Str;
  size_t sVar2;
  undefined1 in_R8B;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  StringRef Str_00;
  StringRef s;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef s_00;
  StringRef Input;
  string local_60;
  char *local_40;
  ulong local_38;
  
  newLineCheck(this);
  sVar2 = S->Length;
  if (sVar2 == 0) {
    pcVar5 = "\'\'";
    sVar2 = 2;
  }
  else if (MustQuote == None) {
    pcVar5 = S->Data;
  }
  else {
    pcVar5 = "\"";
    if (MustQuote == Single) {
      pcVar5 = "\'";
    }
    this->Column = this->Column + 1;
    Str_00.Length = 1;
    Str_00.Data = pcVar5;
    raw_ostream::operator<<(this->Out,Str_00);
    if (MustQuote == Double) {
      Input.Length = 0;
      Input.Data = (char *)S->Length;
      escape_abi_cxx11_(&local_60,(yaml *)S->Data,Input,(bool)in_R8B);
      Str.Length = local_60._M_string_length;
      Str.Data = local_60._M_dataplus._M_p;
      this->Column = this->Column + (int)local_60._M_string_length;
      raw_ostream::operator<<(this->Out,Str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      s.Length = 1;
      s.Data = "\"";
      outputUpToEndOfLine(this,s);
      return;
    }
    pcVar1 = S->Data;
    local_38 = S->Length;
    local_40 = pcVar5;
    if ((int)local_38 == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = local_38 & 0xffffffff;
      uVar6 = 0;
      uVar4 = 0;
      do {
        if (S->Length <= uVar6) {
          __assert_fail("Index < Length && \"Invalid index!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0xf9,"char llvm::StringRef::operator[](size_t) const");
        }
        if (S->Data[uVar6] == '\'') {
          Str_01.Data = pcVar1 + uVar4;
          Str_01.Length._0_4_ = (int)uVar6 - uVar4;
          this->Column = this->Column + (int)Str_01.Length;
          Str_01.Length._4_4_ = 0;
          raw_ostream::operator<<(this->Out,Str_01);
          this->Column = this->Column + 2;
          Str_02.Length = 2;
          Str_02.Data = "\'\'";
          raw_ostream::operator<<(this->Out,Str_02);
          uVar4 = (int)uVar6 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar3);
    }
    Str_03.Length._0_4_ = (int)local_38 - uVar4;
    this->Column = this->Column + (int)Str_03.Length;
    Str_03.Data = pcVar1 + uVar4;
    Str_03.Length._4_4_ = 0;
    raw_ostream::operator<<(this->Out,Str_03);
    sVar2 = 1;
    pcVar5 = local_40;
  }
  s_00.Length = sVar2;
  s_00.Data = pcVar5;
  outputUpToEndOfLine(this,s_00);
  return;
}

Assistant:

void Output::scalarString(StringRef &S, QuotingType MustQuote) {
  newLineCheck();
  if (S.empty()) {
    // Print '' for the empty string because leaving the field empty is not
    // allowed.
    outputUpToEndOfLine("''");
    return;
  }
  if (MustQuote == QuotingType::None) {
    // Only quote if we must.
    outputUpToEndOfLine(S);
    return;
  }

  const char *const Quote = MustQuote == QuotingType::Single ? "'" : "\"";
  output(Quote); // Starting quote.

  // When using double-quoted strings (and only in that case), non-printable characters may be
  // present, and will be escaped using a variety of unicode-scalar and special short-form
  // escapes. This is handled in yaml::escape.
  if (MustQuote == QuotingType::Double) {
    output(yaml::escape(S, /* EscapePrintable= */ false));
    outputUpToEndOfLine(Quote);
    return;
  }

  unsigned i = 0;
  unsigned j = 0;
  unsigned End = S.size();
  const char *Base = S.data();

  // When using single-quoted strings, any single quote ' must be doubled to be escaped.
  while (j < End) {
    if (S[j] == '\'') {                    // Escape quotes.
      output(StringRef(&Base[i], j - i));  // "flush".
      output(StringLiteral("''"));         // Print it as ''
      i = j + 1;
    }
    ++j;
  }
  output(StringRef(&Base[i], j - i));
  outputUpToEndOfLine(Quote); // Ending quote.
}